

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O0

void __thiscall BVStatic<256UL>::And(BVStatic<256UL> *this,BVStatic<256UL> *bv)

{
  BVStatic<256UL> *bv_local;
  BVStatic<256UL> *this_local;
  
  BVStatic<256ul>::for_each<void(BVUnitT<unsigned_long>::*)(BVUnitT<unsigned_long>)>
            ((BVStatic<256ul> *)this,bv,0x2a7e80);
  return;
}

Assistant:

void And(const BVStatic *bv) { this->for_each(bv, &BVUnit::And); }